

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  cmGlobalGenerator *pcVar4;
  ostream *poVar5;
  string *psVar6;
  cmake *this_01;
  bool local_2db;
  undefined1 local_2a0 [16];
  string local_290;
  undefined1 local_270 [8];
  cmake *cm;
  ostringstream w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_ca;
  bool local_c9;
  uint local_c8;
  bool is_ninja;
  bool have_rpath;
  undefined1 local_c0 [8];
  string flagVar;
  string ll;
  string local_78;
  allocator<char> local_41;
  string local_40;
  _Base_ptr local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = (_Base_ptr)config;
  config_local = (string *)this;
  TVar2 = GetType(this);
  if (((TVar2 == EXECUTABLE) || (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) ||
     (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) {
    bVar1 = cmTarget::GetHaveInstallRule(this->Target);
    if (bVar1) {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
      bVar1 = cmMakefile::IsOn(this_00,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"BUILD_WITH_INSTALL_RPATH",
                   (allocator<char> *)(ll.field_2._M_local_buf + 0xf));
        bVar1 = GetPropertyAsBool(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)(ll.field_2._M_local_buf + 0xf));
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        else {
          bVar1 = IsChrpathUsed(this,(string *)local_20);
          if (bVar1) {
            this_local._7_1_ = 0;
          }
          else {
            GetLinkerLanguage((string *)((long)&flagVar.field_2 + 8),this,(string *)local_20);
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_c0,"CMAKE_SHARED_LIBRARY_RUNTIME_",
                         (allocator<char> *)&have_rpath);
              std::allocator<char>::~allocator((allocator<char> *)&have_rpath);
              std::__cxx11::string::operator+=
                        ((string *)local_c0,(string *)(flagVar.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=((string *)local_c0,"_FLAG");
              bVar1 = cmMakefile::IsSet(this->Makefile,(string *)local_c0);
              if (!bVar1) {
                this_local._7_1_ = 0;
              }
              local_c8 = (uint)!bVar1;
              std::__cxx11::string::~string((string *)local_c0);
              if (local_c8 == 0) {
                bVar1 = HaveBuildTreeRPATH(this,(string *)local_20);
                local_2db = true;
                if (!bVar1) {
                  local_2db = HaveInstallTreeRPATH(this,(string *)local_20);
                }
                local_c9 = local_2db;
                pcVar4 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
                (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_f0);
                bVar1 = std::operator==(&local_f0,"Ninja");
                std::__cxx11::string::~string((string *)&local_f0);
                local_ca = bVar1;
                if (((local_c9 & 1U) != 0) && (bVar1)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
                  poVar5 = std::operator<<((ostream *)&cm,"The install of the ");
                  psVar6 = GetName_abi_cxx11_(this);
                  poVar5 = std::operator<<(poVar5,(string *)psVar6);
                  std::operator<<(poVar5,
                                  " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                                 );
                  this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
                  local_270 = (undefined1  [8])this_01;
                  std::__cxx11::ostringstream::str();
                  GetBacktrace((cmGeneratorTarget *)local_2a0);
                  cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_2a0 + 0x10),
                                      (cmListFileBacktrace *)local_2a0);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2a0);
                  std::__cxx11::string::~string((string *)(local_2a0 + 0x10));
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
                }
                this_local._7_1_ = local_c9 & 1;
                local_c8 = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_c8 = 1;
            }
            std::__cxx11::string::~string((string *)(flagVar.field_2._M_local_buf + 8));
          }
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::NeedRelinkBeforeInstall(
  const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if (this->GetType() != cmStateEnums::EXECUTABLE &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY) {
    return false;
  }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // If skipping all rpaths completely then no relinking is needed.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // If building with the install-tree rpath no relinking is needed.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // If chrpath is going to be used no relinking is needed.
  if (this->IsChrpathUsed(config)) {
    return false;
  }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if (!this->Makefile->IsSet(flagVar)) {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
    }
  } else {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
  }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  bool have_rpath =
    this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH(config);
  bool is_ninja =
    this->LocalGenerator->GetGlobalGenerator()->GetName() == "Ninja";

  if (have_rpath && is_ninja) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The install of the " << this->GetName() << " target requires "
      "changing an RPATH from the build tree, but this is not supported "
      "with the Ninja generator unless on an ELF-based platform.  The "
      "CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this "
      "relinking step."
      ;
    /* clang-format on */

    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return have_rpath;
}